

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Own<capnp::ClientHook> __thiscall capnp::_::PointerBuilder::getCapability(PointerBuilder *this)

{
  int iVar1;
  ClientHook *extraout_RDX;
  long in_RSI;
  Own<capnp::ClientHook> OVar2;
  Fault f;
  Fault f_1;
  ClientHook *local_30;
  Maybe<kj::Own<capnp::ClientHook>_> maybeCap;
  
  maybeCap.ptr.disposer = (Disposer *)0x0;
  maybeCap.ptr.ptr = (ClientHook *)0x0;
  if (brokenCapFactory != (long *)0x0) {
    iVar1 = **(int **)(in_RSI + 0x10);
    if ((*(int **)(in_RSI + 0x10))[1] == 0 && iVar1 == 0) {
      (**(code **)(*brokenCapFactory + 8))(this,brokenCapFactory);
    }
    else if (iVar1 == 3) {
      (**(code **)**(undefined8 **)(in_RSI + 8))(&f_1);
      f = f_1;
      kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&f_1);
      if (local_30 == (ClientHook *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                  (&f_1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x8a1,FAILED,(char *)0x0,"\"Message contains invalid capability pointer.\"",
                   (char (*) [45])"Message contains invalid capability pointer.");
        kj::_::Debug::Fault::~Fault(&f_1);
        (**(code **)*brokenCapFactory)
                  (this,brokenCapFactory,"Calling invalid capability pointer.",0x24);
      }
      else {
        this->segment = (SegmentBuilder *)f_1.exception;
        this->capTable = (CapTableBuilder *)local_30;
      }
      kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&f);
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[79]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x899,FAILED,(char *)0x0,
                 "\"Message contains non-capability pointer where capability pointer was expected.\""
                 ,(char (*) [79])
                  "Message contains non-capability pointer where capability pointer was expected.");
      kj::_::Debug::Fault::~Fault(&f);
      (**(code **)*brokenCapFactory)
                (this,brokenCapFactory,"Calling capability extracted from a non-capability pointer."
                 ,0x3c);
    }
    kj::Own<capnp::ClientHook>::dispose(&maybeCap.ptr);
    OVar2.ptr = extraout_RDX;
    OVar2.disposer = (Disposer *)this;
    return OVar2;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[192]>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0x893,FAILED,"brokenCapFactory != nullptr",
             "\"Trying to read capabilities without ever having created a capability context.  \" \"To read capabilities from a message, you must imbue it with CapReaderContext, or \" \"use the Cap\'n Proto RPC system.\""
             ,(char (*) [192])
              "Trying to read capabilities without ever having created a capability context.  To read capabilities from a message, you must imbue it with CapReaderContext, or use the Cap\'n Proto RPC system."
            );
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::Own<ClientHook> PointerBuilder::getCapability() {
  return WireHelpers::readCapabilityPointer(
      segment, capTable, pointer, kj::maxValue);
}